

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial_stream.cpp
# Opt level: O3

void __thiscall create::SerialStream::processByte(SerialStream *this,uint8_t byteRead)

{
  byte bVar1;
  uint64_t *puVar2;
  bool bVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined7 in_register_00000031;
  Packet *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  this->numBytesRead = this->numBytesRead + '\x01';
  uVar6 = (uint32_t)CONCAT71(in_register_00000031,byteRead);
  uVar5 = this->byteSum + uVar6;
  this->byteSum = uVar5;
  switch(this->readState) {
  case READ_HEADER:
    if (this->headerByte != byteRead) {
      return;
    }
    this->readState = READ_NBYTES;
    this->byteSum = uVar6;
    return;
  case READ_NBYTES:
    if (this->expectedNumBytes == byteRead) {
      this->readState = READ_PACKET_ID;
      this->numBytesRead = '\0';
      return;
    }
    break;
  case READ_PACKET_ID:
    this->packetID = byteRead;
    bVar3 = Data::isValidPacketID
                      ((this->super_Serial).data.
                       super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr,byteRead)
    ;
    if (bVar3) {
      Data::getPacket((Data *)&local_20,
                      (uint8_t)(this->super_Serial).data.
                               super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar4 = local_20->nbytes;
      this->expectedNumDataBytes = uVar4;
      if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
        uVar4 = this->expectedNumDataBytes;
      }
      if ((byte)(uVar4 - 1) < 2) {
        this->numDataBytesRead = '\0';
        this->packetBytes = 0;
        this->readState = READ_PACKET_BYTES;
        return;
      }
      __assert_fail("expectedNumDataBytes == 1 || expectedNumDataBytes == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/AutonomyLab[P]libcreate/src/serial_stream.cpp"
                    ,0x35,"virtual void create::SerialStream::processByte(uint8_t)");
    }
    break;
  case READ_PACKET_BYTES:
    uVar4 = this->numDataBytesRead;
    bVar1 = uVar4 + 1;
    this->numDataBytesRead = bVar1;
    if (this->expectedNumDataBytes == 2 && uVar4 == '\0') {
      this->packetBytes = (ushort)byteRead << 8;
    }
    else {
      this->packetBytes = this->packetBytes + (ushort)byteRead;
    }
    if (bVar1 < this->expectedNumDataBytes) {
      return;
    }
    Data::getPacket((Data *)&local_20,
                    (uint8_t)(this->super_Serial).data.
                             super___shared_ptr<create::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Packet::setDataToValidate(local_20,&this->packetBytes);
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    if (this->numBytesRead < this->expectedNumBytes) {
      this->readState = READ_PACKET_ID;
      return;
    }
    this->readState = READ_CHECKSUM;
    return;
  case READ_CHECKSUM:
    if ((char)uVar5 == '\0') {
      Serial::notifyDataReady(&this->super_Serial);
    }
    else {
      puVar2 = &(this->super_Serial).corruptPackets;
      *puVar2 = *puVar2 + 1;
    }
    puVar2 = &(this->super_Serial).totalPackets;
    *puVar2 = *puVar2 + 1;
    break;
  default:
    goto switchD_00140e2e_default;
  }
  this->readState = READ_HEADER;
switchD_00140e2e_default:
  return;
}

Assistant:

void SerialStream::processByte(uint8_t byteRead) {
    numBytesRead++;
    byteSum += byteRead;
    switch (readState) {
      case READ_HEADER:
        if (byteRead == headerByte) {
          readState = READ_NBYTES;
          byteSum = byteRead;
        }
        break;

      case READ_NBYTES:
        if (byteRead == expectedNumBytes) {
          readState = READ_PACKET_ID;
          numBytesRead = 0;
        }
        else {
          //notifyDataReady();
          readState = READ_HEADER;
        }
        break;

      case READ_PACKET_ID:
        packetID = byteRead;
        if (data->isValidPacketID(packetID)) {
          expectedNumDataBytes = data->getPacket(packetID)->nbytes;
          assert(expectedNumDataBytes == 1 || expectedNumDataBytes == 2);
          numDataBytesRead = 0;
          packetBytes = 0;
          readState = READ_PACKET_BYTES;
        }
        else {
          //notifyDataReady();
          readState = READ_HEADER;
        }
        break;

      case READ_PACKET_BYTES:
        numDataBytesRead++;
        if (expectedNumDataBytes == 2 && numDataBytesRead == 1) {
          // High byte first
          packetBytes = (byteRead << 8) & 0xff00;
        }
        else {
          // Low byte
          packetBytes += byteRead;
        }
        if (numDataBytesRead >= expectedNumDataBytes) {
          data->getPacket(packetID)->setDataToValidate(packetBytes);
          if (numBytesRead >= expectedNumBytes)
            readState = READ_CHECKSUM;
          else
            readState = READ_PACKET_ID;
        }
        break;

      case READ_CHECKSUM:
        if ((byteSum & 0xFF) == 0) {
          notifyDataReady();
        }
        else {
          // Corrupt data
          corruptPackets++;
        }
        totalPackets++;
        // Start again
        readState = READ_HEADER;
        break;
    } // end switch (readState)
  }